

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchBase.h
# Opt level: O2

optional<std::basic_string_view<char,_std::char_traits<char>_>_> * __thiscall
SearchBase::findLinkToSubtoken
          (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *__return_storage_ptr__,
          SearchBase *this,string *htmlPage,string_view subtoken,string *capsulationBegin,
          string *capsulationEnd)

{
  pointer pcVar1;
  string_view subtoken_00;
  char *pcVar2;
  bool bVar3;
  size_type __pos;
  size_type sVar4;
  long lVar5;
  char cVar6;
  string_view strv;
  undefined1 local_98 [8];
  string_view subtoken_local;
  string tokenWithCapsulationbegin;
  undefined1 local_48 [8];
  string_view link;
  
  subtoken_local._M_len = (size_t)subtoken._M_str;
  local_98 = (undefined1  [8])subtoken._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)(tokenWithCapsulationbegin.field_2._M_local_buf + 8),
             (basic_string_view<char,_std::char_traits<char>_> *)local_98,
             (allocator<char> *)local_48);
  link._M_str = (char *)__return_storage_ptr__;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &subtoken_local._M_str,capsulationBegin,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&tokenWithCapsulationbegin.field_2 + 8));
  std::__cxx11::string::~string((string *)(tokenWithCapsulationbegin.field_2._M_local_buf + 8));
  do {
    __pos = std::__cxx11::string::find((string *)htmlPage,(ulong)&subtoken_local._M_str);
    if (__pos == 0xffffffffffffffff) {
LAB_001843a5:
      link._M_str[0x10] = '\0';
      goto LAB_00184427;
    }
    lVar5 = capsulationBegin->_M_string_length + __pos;
    tokenWithCapsulationbegin.field_2._8_8_ = htmlPage->_M_string_length - lVar5;
    pcVar1 = (htmlPage->_M_dataplus)._M_p;
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       ((long)&tokenWithCapsulationbegin.field_2 + 8),
                       (capsulationEnd->_M_dataplus)._M_p,0,capsulationEnd->_M_string_length);
    if (sVar4 == 0xffffffffffffffff) goto LAB_001843a5;
    subtoken_00._M_str = (char *)subtoken_local._M_len;
    subtoken_00._M_len = (size_t)local_98;
    strv._M_str = pcVar1 + lVar5;
    strv._M_len = sVar4;
    tokenWithCapsulationbegin.field_2._8_8_ = sVar4;
    bVar3 = isSubtoken(this,strv,subtoken_00);
  } while (!bVar3);
  link._M_len = (size_t)(htmlPage->_M_dataplus)._M_p;
  local_48 = (undefined1  [8])htmlPage->_M_string_length;
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_48,"<a href=\"",__pos
                     ,9);
  if (sVar4 == 0xffffffffffffffff) {
    cVar6 = '\0';
  }
  else {
    link._M_len = link._M_len + sVar4 + 9;
    local_48 = (undefined1  [8])((long)local_48 - (sVar4 + 9));
    cVar6 = '\0';
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_48,"\"",0,1);
    if (sVar4 != 0xffffffffffffffff) {
      *(size_type *)link._M_str = sVar4;
      *(size_t *)(link._M_str + 8) = link._M_len;
      cVar6 = '\x01';
      local_48 = (undefined1  [8])sVar4;
    }
  }
  link._M_str[0x10] = cVar6;
LAB_00184427:
  pcVar2 = link._M_str;
  std::__cxx11::string::~string((string *)&subtoken_local._M_str);
  return (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)pcVar2;
}

Assistant:

std::optional<std::string_view> findLinkToSubtoken(const std::string& htmlPage, std::string_view subtoken, const std::string& capsulationBegin, const std::string& capsulationEnd) const {
		const std::string_view link_token_begin = "<a href=\"";
		const std::string_view link_token_end = "\"";

		const std::string tokenWithCapsulationbegin = capsulationBegin + std::string(subtoken);

		size_t capsulationBegin_pos = htmlPage.find(tokenWithCapsulationbegin);
		while (capsulationBegin_pos != std::string::npos) {
			std::string_view token_element = std::string_view(htmlPage);
			token_element.remove_prefix(capsulationBegin_pos + capsulationBegin.length());

			const size_t capsulationEnd_pos = token_element.find(capsulationEnd);
			if (capsulationEnd_pos == std::string::npos) {
				return {};
			}
			token_element.remove_suffix(token_element.length() - capsulationEnd_pos);

			if (isSubtoken(token_element, subtoken)) {
				std::string_view link = std::string_view(htmlPage);
				const size_t link_token_begin_pos = link.rfind(link_token_begin, capsulationBegin_pos);
				if (link_token_begin_pos == std::string::npos) {
					return {};
				}
				link.remove_prefix(link_token_begin_pos + link_token_begin.length());


				const size_t link_token_end_pos = link.find(link_token_end);
				if (link_token_end_pos == std::string::npos) {
					return {};
				}
				link.remove_suffix(link.length() - link_token_end_pos);

				return link;
			}

			capsulationBegin_pos = htmlPage.find(tokenWithCapsulationbegin, capsulationBegin_pos + tokenWithCapsulationbegin.length());
		}
		return {};
	}